

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

BOOL __thiscall
Js::TypedArray<int,_false,_false>::DirectSetItem
          (TypedArray<int,_false,_false> *this,uint32 index,Var value)

{
  BOOL BVar1;
  Var value_local;
  uint32 index_local;
  TypedArray<int,_false,_false> *this_local;
  
  BVar1 = BaseTypedDirectSetItem(this,index,value,JavascriptConversion::ToInt32);
  return BVar1;
}

Assistant:

inline BOOL Int32Array::DirectSetItem(__in uint32 index, __in Js::Var value)
    {
        return BaseTypedDirectSetItem(index, value, JavascriptConversion::ToInt32);
    }